

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOArrayLengthCase::init
          (SSBOArrayLengthCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  ArrayAccess AVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  ostream *poVar5;
  ProgramSources *sources;
  TestError *pTVar6;
  char *pcVar7;
  bool *__s;
  allocator<char> local_305;
  deUint32 invalidValue;
  string qualifierStr;
  GLint result;
  string local_2d8 [32];
  string sizeStr;
  string local_298;
  ostream local_278;
  GLenum prop;
  pointer local_50;
  undefined1 uStack_48;
  undefined7 uStack_47;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  invalidValue = 0xffffffff;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&prop,0,0xac);
  local_50 = (pointer)0x0;
  uStack_48 = 0;
  uStack_47 = 0;
  uStack_40 = 0;
  uStack_3f = 0;
  pcVar7 = glcts::fixed_sample_locations_values + 1;
  if (this->m_access == ACCESS_WRITEONLY) {
    pcVar7 = "writeonly ";
  }
  __s = (bool *)0x173774b;
  if (this->m_access != ACCESS_READONLY) {
    __s = (bool *)pcVar7;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&qualifierStr,__s,(allocator<char> *)&local_278);
  if (this->m_sized == true) {
    local_278._vptr_basic_ostream._0_4_ = 0x10;
    de::toString<int>(&sizeStr,(int *)&local_278);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sizeStr,glcts::fixed_sample_locations_values + 1,&local_305);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
  poVar5 = std::operator<<(&local_278,"#version 310 es\n");
  poVar5 = std::operator<<(poVar5,"layout(local_size_x = 1, local_size_y = 1) in;\n");
  poVar5 = std::operator<<(poVar5,"layout(std430) buffer;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"layout(binding = 0) buffer Out\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    int outLength;\n");
  poVar5 = std::operator<<(poVar5,"    uint unused;\n");
  poVar5 = std::operator<<(poVar5,"} sb_out;\n");
  poVar5 = std::operator<<(poVar5,"layout(binding = 1) ");
  poVar5 = std::operator<<(poVar5,(string *)&qualifierStr);
  poVar5 = std::operator<<(poVar5,"buffer Target\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    float array[");
  poVar5 = std::operator<<(poVar5,(string *)&sizeStr);
  poVar5 = std::operator<<(poVar5,"];\n");
  poVar5 = std::operator<<(poVar5,"} sb_target;\n\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  std::operator<<(poVar5,"{\n");
  AVar2 = this->m_access;
  if ((AVar2 & ~ACCESS_READONLY) == ACCESS_DEFAULT) {
    std::operator<<(&local_278,"    sb_out.unused = uint(sb_target.array[1]);\n");
    AVar2 = this->m_access;
  }
  if (AVar2 < ACCESS_READONLY) {
    std::operator<<(&local_278,"    sb_target.array[2] = float(sb_out.unused);\n");
  }
  poVar5 = std::operator<<(&local_278,"\n");
  poVar5 = std::operator<<(poVar5,"    sb_out.outLength = sb_target.array.length();\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
  std::__cxx11::string::~string((string *)&sizeStr);
  std::__cxx11::string::~string((string *)&qualifierStr);
  glu::ComputeSource::ComputeSource((ComputeSource *)&result,&local_298);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&prop,(ShaderSource *)&result);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,sources);
  this->m_shader = this_00;
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string((string *)&local_298);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&prop);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_shader);
  if ((this->m_shader->m_program).m_info.linkOk == false) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Failed to build shader",(allocator<char> *)&prop);
    tcu::TestError::TestError(pTVar6,(string *)&local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_outputBufferID);
  (**(code **)(lVar4 + 0x40))(0x90d2,this->m_outputBufferID);
  (**(code **)(lVar4 + 0x150))(0x90d2,8,&invalidValue,0x88ea);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_targetBufferID);
  (**(code **)(lVar4 + 0x40))(0x90d2,this->m_targetBufferID);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"create buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0x6e);
  (**(code **)(lVar4 + 0x48))(0x90d2,0,this->m_outputBufferID);
  (**(code **)(lVar4 + 0x48))(0x90d2,1,this->m_targetBufferID);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"bind buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0x73);
  iVar1 = (**(code **)(lVar4 + 0x9a8))((this->m_shader->m_program).m_program,0x92e5,"Out.outLength")
  ;
  prop = 0x92fc;
  result = 0;
  if (iVar1 == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Failed to find outLength variable",
               (allocator<char> *)&qualifierStr);
    tcu::TestError::TestError(pTVar6,(string *)&local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar4 + 0x9c8))
            ((this->m_shader->m_program).m_program,0x92e5,iVar1,1,&prop,1,0,(ShaderSource *)&result)
  ;
  if (result != 0) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Unexpected outLength location",(allocator<char> *)&qualifierStr
              );
    tcu::TestError::TestError(pTVar6,(string *)&local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar1 = (**(code **)(lVar4 + 0x9a8))((this->m_shader->m_program).m_program,0x92e5,"Out.unused");
  prop = 0x92fc;
  result = 0;
  if (iVar1 == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Failed to find unused variable",
               (allocator<char> *)&qualifierStr);
    tcu::TestError::TestError(pTVar6,(string *)&local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar4 + 0x9c8))
            ((this->m_shader->m_program).m_program,0x92e5,iVar1,1,&prop,1,0,(ShaderSource *)&result)
  ;
  if (result != 4) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Unexpected unused location",(allocator<char> *)&qualifierStr);
    tcu::TestError::TestError(pTVar6,(string *)&local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar1 = (**(code **)(lVar4 + 0x9a8))((this->m_shader->m_program).m_program,0x92e5,"Target.array");
  prop = 0x92fe;
  result = 0;
  if (iVar1 == -1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"Failed to find array variable",(allocator<char> *)&qualifierStr
              );
    tcu::TestError::TestError(pTVar6,(string *)&local_278);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar1 = (**(code **)(lVar4 + 0x9c8))
                    ((this->m_shader->m_program).m_program,0x92e5,iVar1,1,&prop,1,0,
                     (ShaderSource *)&result);
  if (result == 4) {
    return iVar1;
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"Unexpected array stride",(allocator<char> *)&qualifierStr);
  tcu::TestError::TestError(pTVar6,(string *)&local_278);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SSBOArrayLengthCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			invalidValue	= 0xFFFFFFFFUL;

	// program
	m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource()));
	m_testCtx.getLog() << *m_shader;

	if (!m_shader->isOk())
		throw tcu::TestError("Failed to build shader");

	// gen and attach buffers
	gl.genBuffers(1, &m_outputBufferID);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBufferID);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, 2 * (int)sizeof(deUint32), &invalidValue, GL_DYNAMIC_COPY);

	gl.genBuffers(1, &m_targetBufferID);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_targetBufferID);

	GLU_EXPECT_NO_ERROR(gl.getError(), "create buffers");

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_outputBufferID);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_targetBufferID);

	GLU_EXPECT_NO_ERROR(gl.getError(), "bind buffers");

	// check the ssbo has expected layout
	{
		const deUint32		index	= gl.getProgramResourceIndex(m_shader->getProgram(), GL_BUFFER_VARIABLE, "Out.outLength");
		const glw::GLenum	prop	= GL_OFFSET;
		glw::GLint			result	= 0;

		if (index == GL_INVALID_INDEX)
			throw tcu::TestError("Failed to find outLength variable");

		gl.getProgramResourceiv(m_shader->getProgram(), GL_BUFFER_VARIABLE, index, 1, &prop, 1, DE_NULL, &result);

		if (result != 0)
			throw tcu::TestError("Unexpected outLength location");
	}
	{
		const deUint32		index	= gl.getProgramResourceIndex(m_shader->getProgram(), GL_BUFFER_VARIABLE, "Out.unused");
		const glw::GLenum	prop	= GL_OFFSET;
		glw::GLint			result	= 0;

		if (index == GL_INVALID_INDEX)
			throw tcu::TestError("Failed to find unused variable");

		gl.getProgramResourceiv(m_shader->getProgram(), GL_BUFFER_VARIABLE, index, 1, &prop, 1, DE_NULL, &result);

		if (result != 4)
			throw tcu::TestError("Unexpected unused location");
	}
	{
		const deUint32		index	= gl.getProgramResourceIndex(m_shader->getProgram(), GL_BUFFER_VARIABLE, "Target.array");
		const glw::GLenum	prop	= GL_ARRAY_STRIDE;
		glw::GLint			result	= 0;

		if (index == GL_INVALID_INDEX)
			throw tcu::TestError("Failed to find array variable");

		gl.getProgramResourceiv(m_shader->getProgram(), GL_BUFFER_VARIABLE, index, 1, &prop, 1, DE_NULL, &result);

		if (result != 4)
			throw tcu::TestError("Unexpected array stride");
	}
}